

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_duration(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  StrX local_5f0;
  StrX local_5e0;
  StrX local_5d0;
  long local_5c0;
  XMLCh *actRetCanRep_5;
  undefined1 local_5b0 [4];
  Status myStatus_17;
  StrX local_5a0;
  StrX local_590;
  long local_580;
  XMLCh *actRetCanRep_4;
  undefined1 local_570 [4];
  Status myStatus_16;
  StrX local_560;
  StrX local_550;
  long local_540;
  XMLCh *actRetCanRep_3;
  undefined1 local_530 [4];
  Status myStatus_15;
  StrX local_520;
  StrX local_510;
  long local_500;
  XMLCh *actRetCanRep_2;
  undefined1 local_4f0 [4];
  Status myStatus_14;
  StrX local_4e0;
  StrX local_4d0;
  long local_4c0;
  XMLCh *actRetCanRep_1;
  undefined1 local_4b0 [4];
  Status myStatus_13;
  StrX local_4a0;
  StrX local_490;
  long local_480;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_460;
  StrX local_450;
  XSValue *local_440;
  XSValue *actRetValue_5;
  undefined1 local_430 [4];
  Status myStatus_11;
  StrX local_420;
  StrX local_410;
  XSValue *local_400;
  XSValue *actRetValue_4;
  undefined1 local_3f0 [4];
  Status myStatus_10;
  StrX local_3e0;
  StrX local_3d0;
  XSValue *local_3c0;
  XSValue *actRetValue_3;
  undefined1 local_3b0 [4];
  Status myStatus_9;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  StrX local_350;
  XSValue *local_340;
  XSValue *actRetValue_2;
  undefined1 local_330 [4];
  Status myStatus_8;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  StrX local_2d0;
  XSValue *local_2c0;
  XSValue *actRetValue_1;
  undefined1 local_2b0 [4];
  Status myStatus_7;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  StrX local_250;
  XSValue *local_240;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_220;
  StrX local_210;
  byte local_1fd;
  Status local_1fc;
  undefined1 local_1f8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1e8;
  StrX local_1d8;
  byte local_1c5;
  Status local_1c4;
  undefined1 local_1c0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1b0;
  StrX local_1a0;
  byte local_18d;
  Status local_18c;
  undefined1 local_188 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_178;
  byte local_165;
  Status local_164;
  undefined1 local_160 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_150;
  byte local_13d;
  Status local_13c;
  undefined1 local_138 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_118;
  byte local_105;
  Status local_104;
  undefined1 local_100 [3];
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [12];
  char iv_2 [15];
  char cStack_61;
  char iv_1 [16];
  char v_3 [13];
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char v_2 [21];
  char acStack_28 [8];
  char v_1 [22];
  bool toValidate;
  DataType dt;
  
  stack0xfffffffffffffff4 = 5;
  v_1[0x13] = '\x01';
  builtin_strncpy(v_1 + 8,"S   \n",6);
  builtin_strncpy(acStack_28,"   P1Y1M",8);
  builtin_strncpy(v_1,"1DT1H1M1",8);
  builtin_strncpy(v_3 + 8,"P1Y1M",5);
  cStack_43 = '3';
  cStack_42 = '1';
  cStack_41 = 'D';
  builtin_strncpy(v_3,"T23H",5);
  builtin_strncpy(iv_1 + 8,"-P1Y1M1D",8);
  builtin_strncpy(iv_2 + 8,"P-1Y2M3",7);
  cStack_61 = 'D';
  builtin_strncpy(iv_1,"T10H30M",8);
  builtin_strncpy(iv_2,"1H1M1X",7);
  stack0xffffffffffffff88 = 0x44314d31593150;
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 8.62621957972257e+97;
  iv_3[0] = '2';
  iv_3[1] = '3';
  iv_3[2] = 'H';
  iv_3[3] = '\0';
  act_v_ran_v_1.f_datatype = dt_boolean;
  act_v_ran_v_1._4_4_ = 1;
  act_v_ran_v_1.fValue.f_int = 1;
  act_v_ran_v_1.fValue.f_datetime.f_month = 1;
  act_v_ran_v_1.fValue.f_datetime.f_day = 1;
  act_v_ran_v_1.fValue.f_datetime.f_hour = 1;
  act_v_ran_v_1.fValue._16_8_ = 0;
  act_v_ran_v_2.f_datatype = dt_boolean;
  act_v_ran_v_2._4_4_ = 1;
  act_v_ran_v_2.fValue.f_int = 0x1f;
  act_v_ran_v_2.fValue.f_datetime.f_month = 0x17;
  act_v_ran_v_2.fValue.f_datetime.f_day = 0x77;
  act_v_ran_v_2.fValue.f_datetime.f_hour = 0x78;
  act_v_ran_v_2.fValue._16_8_ = 0;
  act_v_ran_v_3.f_datatype = ~dt_string;
  act_v_ran_v_3._4_4_ = 0xffffffff;
  act_v_ran_v_3.fValue.f_int = -1;
  act_v_ran_v_3.fValue.f_datetime.f_month = -0x17;
  act_v_ran_v_3.fValue.f_datetime.f_day = 0;
  act_v_ran_v_3.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_3.fValue._16_8_ = 0;
  local_104 = st_Init;
  StrX::StrX(&local_118,acStack_28);
  pXVar4 = StrX::unicodeForm(&local_118);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_104,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_118);
  local_105 = bVar1 & 1;
  if (local_105 != 1) {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX((StrX *)local_138,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_138);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe24,acStack_28,pcVar5,1);
    StrX::~StrX((StrX *)local_138);
    errSeen = true;
  }
  local_13c = st_Init;
  StrX::StrX(&local_150,v_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_150);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_150);
  local_13d = bVar1 & 1;
  if (local_13d != 1) {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX((StrX *)local_160,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_160);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe25,v_3 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_160);
    errSeen = true;
  }
  local_164 = st_Init;
  StrX::StrX(&local_178,iv_1 + 8);
  pXVar4 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_164,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 != 1) {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX((StrX *)local_188,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_188);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe26,iv_1 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_188);
    errSeen = true;
  }
  local_18c = st_Init;
  StrX::StrX(&local_1a0,iv_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_1a0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_18c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a0);
  local_18d = bVar1 & 1;
  if (local_18d == 0) {
    if (local_18c != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)local_1c0,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_1c0);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_18c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe29,iv_2 + 8,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_1c0);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX(&local_1b0,pXVar4);
    pcVar5 = StrX::localForm(&local_1b0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe29,iv_2 + 8,pcVar5,0);
    StrX::~StrX(&local_1b0);
    errSeen = true;
  }
  local_1c4 = st_Init;
  StrX::StrX(&local_1d8,iv_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_1d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_1c4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1d8);
  local_1c5 = bVar1 & 1;
  if (local_1c5 == 0) {
    if (local_1c4 != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)local_1f8,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_1f8);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_1c4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe2a,iv_3 + 8,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_1f8);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX(&local_1e8,pXVar4);
    pcVar5 = StrX::localForm(&local_1e8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2a,iv_3 + 8,pcVar5,0);
    StrX::~StrX(&local_1e8);
    errSeen = true;
  }
  local_1fc = st_Init;
  StrX::StrX(&local_210,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_210);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_duration,&local_1fc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_210);
  local_1fd = bVar1 & 1;
  if (local_1fd == 0) {
    if (local_1fc != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)&myStatus_6,pXVar4);
      pcVar5 = StrX::localForm((StrX *)&myStatus_6);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_1fc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe2b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)&myStatus_6);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_duration);
    StrX::StrX(&local_220,pXVar4);
    pcVar5 = StrX::localForm(&local_220);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX(&local_220);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    v_1[0x13] = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_250,acStack_28);
    pXVar4 = StrX::unicodeForm(&local_250);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)&actRetValue,ver_10,(bool)(v_1[0x13] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_250);
    local_240 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)local_2b0,pXVar4);
      StrX::localForm((StrX *)local_2b0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe45,acStack_28);
      StrX::~StrX((StrX *)local_2b0);
      errSeen = true;
    }
    else {
      memcpy(&local_278,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_2a0,pvVar10,0x28);
      actValue.fValue.f_long = uStack_270;
      actValue._0_8_ = local_278;
      actValue.fValue._8_8_ = local_268;
      actValue.fValue._16_8_ = uStack_260;
      actValue.fValue.f_datetime.f_milisec = (double)local_258;
      expValue.fValue.f_long = uStack_298;
      expValue._0_8_ = local_2a0;
      expValue.fValue._8_8_ = local_290;
      expValue.fValue._16_8_ = uStack_288;
      expValue.fValue.f_datetime.f_milisec = (double)local_280;
      bVar2 = compareActualValue(dt_duration,actValue,expValue);
      pXVar6 = local_240;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_240 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_240);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_2d0,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_2d0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)((long)&actRetValue_1 + 4),ver_10,
                        (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2d0);
    local_2c0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)local_330,pXVar4);
      StrX::localForm((StrX *)local_330);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe46,v_3 + 8);
      StrX::~StrX((StrX *)local_330);
      errSeen = true;
    }
    else {
      memcpy(&local_2f8,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_320,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_2f0;
      actValue_00._0_8_ = local_2f8;
      actValue_00.fValue._8_8_ = local_2e8;
      actValue_00.fValue._16_8_ = uStack_2e0;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_2d8;
      expValue_00.fValue.f_long = uStack_318;
      expValue_00._0_8_ = local_320;
      expValue_00.fValue._8_8_ = local_310;
      expValue_00.fValue._16_8_ = uStack_308;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_300;
      bVar2 = compareActualValue(dt_duration,actValue_00,expValue_00);
      pXVar6 = local_2c0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_350,iv_1 + 8);
    pXVar4 = StrX::unicodeForm(&local_350);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)((long)&actRetValue_2 + 4),ver_10,
                        (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_350);
    local_340 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX((StrX *)local_3b0,pXVar4);
      StrX::localForm((StrX *)local_3b0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe47,iv_1 + 8);
      StrX::~StrX((StrX *)local_3b0);
      errSeen = true;
    }
    else {
      memcpy(&local_378,pXVar6,0x28);
      __src = local_100;
      memcpy(&local_3a0,__src,0x28);
      actValue_01.fValue.f_long = uStack_370;
      actValue_01._0_8_ = local_378;
      actValue_01.fValue._8_8_ = local_368;
      actValue_01.fValue._16_8_ = uStack_360;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_358;
      expValue_01.fValue.f_long = uStack_398;
      expValue_01._0_8_ = local_3a0;
      expValue_01.fValue._8_8_ = local_390;
      expValue_01.fValue._16_8_ = uStack_388;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_380;
      bVar2 = compareActualValue(dt_duration,actValue_01,expValue_01);
      pXVar6 = local_340;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_340 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_340);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,__src);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_3d0,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_3d0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)((long)&actRetValue_3 + 4),ver_10,
                        (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3d0);
    local_3c0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_3f0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3f0);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4a,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3f0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_3e0,pXVar4);
      StrX::localForm(&local_3e0);
      pvVar10 = (void *)0xe4a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4a,iv_2 + 8);
      StrX::~StrX(&local_3e0);
      pXVar6 = local_3c0;
      errSeen = true;
      if (local_3c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_410,iv_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_410);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)((long)&actRetValue_4 + 4),ver_10,
                        (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_410);
    local_400 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_430,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_430);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4b,iv_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_430);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_420,pXVar4);
      StrX::localForm(&local_420);
      pvVar10 = (void *)0xe4b;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4b,iv_3 + 8);
      StrX::~StrX(&local_420);
      pXVar6 = local_400;
      errSeen = true;
      if (local_400 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_400);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_450,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_450);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_duration,(Status *)((long)&actRetValue_5 + 4),ver_10,
                        (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_450);
    local_440 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)&myStatus_12,pXVar4);
        pcVar5 = StrX::localForm((StrX *)&myStatus_12);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4c,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)&myStatus_12);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_460,pXVar4);
      StrX::localForm(&local_460);
      pvVar10 = (void *)0xe4c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4c,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_460);
      pXVar6 = local_440;
      errSeen = true;
      if (local_440 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_440);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    v_1[0x13] = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_490,acStack_28);
    pXVar4 = StrX::unicodeForm(&local_490);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)&actRetCanRep,ver_10,(bool)(v_1[0x13] & 1),
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_490);
    local_480 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_4b0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4b0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe68,acStack_28,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4b0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_4a0,pXVar4);
      StrX::localForm(&local_4a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe68,acStack_28);
      StrX::~StrX(&local_4a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_480);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_4d0,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_4d0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)((long)&actRetCanRep_1 + 4),ver_10,
                       (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4d0);
    local_4c0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_4f0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4f0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe69,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4f0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_4e0,pXVar4);
      StrX::localForm(&local_4e0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe69,v_3 + 8);
      StrX::~StrX(&local_4e0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4c0);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_510,iv_1 + 8);
    pXVar4 = StrX::unicodeForm(&local_510);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)((long)&actRetCanRep_2 + 4),ver_10,
                       (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_510);
    local_500 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_530,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_530);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe6a,iv_1 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_530);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_520,pXVar4);
      StrX::localForm(&local_520);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe6a,iv_1 + 8);
      StrX::~StrX(&local_520);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_500);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_550,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_550);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)((long)&actRetCanRep_3 + 4),ver_10,
                       (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_550);
    local_540 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if ((v_1[0x13] & 1U) != 0) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_570,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_570);
        pcVar7 = getStatusString(((byte)v_1[0x13] & 1) * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe6e,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_570);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_560,pXVar4);
      StrX::localForm(&local_560);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe6e,iv_2 + 8);
      StrX::~StrX(&local_560);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_540);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_590,iv_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_590);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)((long)&actRetCanRep_4 + 4),ver_10,
                       (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_590);
    local_580 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if ((v_1[0x13] & 1U) != 0) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX((StrX *)local_5b0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_5b0);
        pcVar7 = getStatusString(((byte)v_1[0x13] & 1) * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe70,iv_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_5b0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_5a0,pXVar4);
      StrX::localForm(&local_5a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe70,iv_3 + 8);
      StrX::~StrX(&local_5a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_580);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_5d0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_5d0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_duration,(Status *)((long)&actRetCanRep_5 + 4),ver_10,
                       (bool)(v_1[0x13] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5d0);
    local_5c0 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if ((v_1[0x13] & 1U) != 0) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_duration);
        StrX::StrX(&local_5f0,pXVar4);
        pcVar5 = StrX::localForm(&local_5f0);
        pcVar7 = getStatusString(((byte)v_1[0x13] & 1) * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe72,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_5f0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_duration);
      StrX::StrX(&local_5e0,pXVar4);
      StrX::localForm(&local_5e0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe72,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_5e0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5c0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_duration()
{
    const XSValue::DataType dt = XSValue::dt_duration;
    bool  toValidate = true;

    const char v_1[]="   P1Y1M1DT1H1M1S   \n";
    const char v_2[]="P1Y1M31DT23H119M120S";
    const char v_3[]="-P1Y1M1DT23H";

    const char iv_1[]="P-1Y2M3DT10H30M";
    const char iv_2[]="P1Y1M1DT1H1M1X";
    const char iv_3[]="P1Z1M1DT23H";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;
    act_v_ran_v_1.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 1;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 119;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 120;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = -1;
    act_v_ran_v_3.fValue.f_datetime.f_month   = -1;
    act_v_ran_v_3.fValue.f_datetime.f_day     = -1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = -23;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}